

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings_tests.cpp
# Opt level: O1

CMutableTransaction * blockencodings_tests::BuildTransactionTestCase(void)

{
  long lVar1;
  CMutableTransaction *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(in_RDI);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&in_RDI->vin,1);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
            (&(((in_RDI->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,10);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&in_RDI->vout,1);
  ((in_RDI->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
   super__Vector_impl_data._M_start)->nValue = 0x2a;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static CMutableTransaction BuildTransactionTestCase() {
    CMutableTransaction tx;
    tx.vin.resize(1);
    tx.vin[0].scriptSig.resize(10);
    tx.vout.resize(1);
    tx.vout[0].nValue = 42;
    return tx;
}